

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorLink.c
# Opt level: O3

void ExorLinkCubeIteratorCleanUp(int fTakeLastGroup)

{
  Cube *pCVar1;
  int iVar2;
  drow *pdVar3;
  Cube **ppCVar4;
  long lVar5;
  
  if (fWorking == '\0') {
    __assert_fail("fWorking",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                  ,0x2cc,"void ExorLinkCubeIteratorCleanUp(int)");
  }
  if (fTakeLastGroup == 0) {
    if (0 < nCubesInGroup) {
      ppCVar4 = ELCubes;
      lVar5 = 0;
      do {
        pCVar1 = *ppCVar4;
        pCVar1->fMark = '\0';
        AddToFreeCubes(pCVar1);
        *ppCVar4 = (Cube *)0x0;
        lVar5 = lVar5 + 1;
        ppCVar4 = ppCVar4 + 1;
      } while (lVar5 < nCubesInGroup);
    }
  }
  else if (0 < nCubesInGroup) {
    pdVar3 = s_BitMasks;
    ppCVar4 = ELCubes;
    lVar5 = 0;
    iVar2 = nCubesInGroup;
    do {
      pCVar1 = *ppCVar4;
      if (pCVar1 != (Cube *)0x0) {
        pCVar1->fMark = '\0';
        if ((LastGroup & *pdVar3) == 0) {
          AddToFreeCubes(pCVar1);
          iVar2 = nCubesInGroup;
        }
        *ppCVar4 = (Cube *)0x0;
      }
      lVar5 = lVar5 + 1;
      pdVar3 = pdVar3 + 1;
      ppCVar4 = ppCVar4 + 1;
    } while (lVar5 < iVar2);
  }
  VisitedGroups = 0;
  fWorking = 0;
  return;
}

Assistant:

void ExorLinkCubeIteratorCleanUp( int fTakeLastGroup )
// removes the cubes from the store back into the list of free cubes
// if fTakeLastGroup is 0, removes all cubes
// if fTakeLastGroup is 1, does not store the last group
{
    int c;
    assert( fWorking );

    // put cubes back
    // set the cube pointers to zero
    if ( fTakeLastGroup == 0 )
        for ( c = 0; c < nCubesInGroup; c++ )
        {
            ELCubes[c]->fMark = 0;
            AddToFreeCubes( ELCubes[c] );
            ELCubes[c] = NULL;
        }
    else
        for ( c = 0; c < nCubesInGroup; c++ )
        if ( ELCubes[c] )
        {
            ELCubes[c]->fMark = 0;
            if ( (LastGroup & s_BitMasks[c]) == 0 ) // does not belong to the last group
                AddToFreeCubes( ELCubes[c] );
            ELCubes[c] = NULL;
        }

    // set the cube groups to zero
    VisitedGroups = 0;
    // shut down the iterator
    fWorking = 0;
}